

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QNetworkAddressEntry>>
          (QtPrivate *this,QDebug debug,char *which,QList<QNetworkAddressEntry> *c)

{
  uint *puVar1;
  QNetworkAddressEntry *pQVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  QDebug *pQVar6;
  _Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false> *entry;
  QDebug debug_00;
  QNetworkAddressEntry *pQVar7;
  long in_FS_OFFSET;
  _Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false> local_60;
  Stream local_58 [8];
  _Head_base<0UL,_QNetworkAddressEntryPrivate_*,_false> local_50;
  Stream local_48 [8];
  QDebugStateSaver saver;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  pQVar6 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar6,'(');
  pQVar7 = (c->d).ptr;
  lVar4 = (c->d).size;
  pQVar2 = pQVar7 + lVar4;
  if (lVar4 == 0) goto LAB_001afd41;
  local_50._M_head_impl = *(QNetworkAddressEntryPrivate **)debug.stream;
  entry = &local_50;
  puVar1 = &((local_50._M_head_impl)->validityLifetime).t2;
  *puVar1 = *puVar1 + 1;
  debug_00.stream = local_48;
  while( true ) {
    ::operator<<(debug_00,(QNetworkAddressEntry *)entry);
    QDebug::~QDebug((QDebug *)debug_00.stream);
    QDebug::~QDebug((QDebug *)entry);
    pQVar7 = pQVar7 + 1;
LAB_001afd41:
    if (pQVar7 == pQVar2) break;
    pQVar6 = QDebug::operator<<((QDebug *)debug.stream,", ");
    local_60._M_head_impl = (QNetworkAddressEntryPrivate *)pQVar6->stream;
    entry = &local_60;
    puVar1 = &((local_60._M_head_impl)->validityLifetime).t2;
    *puVar1 = *puVar1 + 1;
    debug_00.stream = local_58;
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar5 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar5;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}